

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# printf-test.cc
# Opt level: O2

wstring * make_positional_abi_cxx11_(wstring *__return_storage_ptr__,wstring_view format)

{
  ulong uVar1;
  
  (__return_storage_ptr__->_M_dataplus)._M_p = (pointer)&__return_storage_ptr__->field_2;
  std::__cxx11::wstring::_M_construct<wchar_t_const*>
            ((wstring *)__return_storage_ptr__,format.data_,format.data_ + format.size_);
  uVar1 = std::__cxx11::wstring::find((wchar_t)__return_storage_ptr__,0x25);
  std::__cxx11::wstring::replace((ulong)__return_storage_ptr__,uVar1,(wchar_t *)0x1);
  return __return_storage_ptr__;
}

Assistant:

static std::wstring make_positional(fmt::wstring_view format) {
  std::wstring s(format.data(), format.size());
  s.replace(s.find(L'%'), 1, L"%1$");
  return s;
}